

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

TPZVec<TPZGeoElSidePartition> * __thiscall
TPZVec<TPZGeoElSidePartition>::operator=
          (TPZVec<TPZGeoElSidePartition> *this,TPZVec<TPZGeoElSidePartition> *copy)

{
  int64_t iVar1;
  TPZGeoElSidePartition *in_RSI;
  TPZGeoElSidePartition *in_RDI;
  int64_t i;
  TPZGeoElSidePartition *in_stack_ffffffffffffffd8;
  long local_18;
  
  if (in_RDI != in_RSI) {
    iVar1 = NElements((TPZVec<TPZGeoElSidePartition> *)in_RSI);
    (*(in_RDI->fCurrent).super_TPZSavable._vptr_TPZSavable[3])(in_RDI,iVar1);
    for (local_18 = 0; local_18 < *(long *)&(in_RSI->fCurrent).fSide; local_18 = local_18 + 1) {
      TPZGeoElSidePartition::operator=(in_RDI,in_stack_ffffffffffffffd8);
    }
  }
  return (TPZVec<TPZGeoElSidePartition> *)in_RDI;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const TPZVec<T> &copy){
    if (this != &copy) {

      Resize(copy.NElements());

      for (int64_t i = 0; i < copy.fNElements; i++)
          fStore[i] = copy.fStore[i];
    }
    return *this;
}